

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool operator<(CService *a,CService *b)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  CNetAddr local_a0;
  CNetAddr local_80;
  CNetAddr local_60;
  CNetAddr local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&local_40,&a->super_CNetAddr);
  CNetAddr::CNetAddr(&local_60,&b->super_CNetAddr);
  bVar1 = operator<(&local_40,&local_60);
  bVar2 = true;
  if (!bVar1) {
    CNetAddr::CNetAddr(&local_80,&a->super_CNetAddr);
    CNetAddr::CNetAddr(&local_a0,&b->super_CNetAddr);
    bVar2 = operator==(&local_80,&local_a0);
    bVar2 = bVar2 && a->port < b->port;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_a0.m_addr);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_80.m_addr);
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_60.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_40.m_addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const CService& a, const CService& b)
{
    return static_cast<CNetAddr>(a) < static_cast<CNetAddr>(b) || (static_cast<CNetAddr>(a) == static_cast<CNetAddr>(b) && a.port < b.port);
}